

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopGroup.cpp
# Opt level: O1

shared_ptr<Liby::TcpClient> __thiscall
Liby::EventLoopGroup::creatTcpClient(EventLoopGroup *this,string *host,string *service)

{
  int *piVar1;
  undefined8 uVar2;
  long *plVar3;
  int iVar4;
  string *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  shared_ptr<Liby::TcpClient> sVar6;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  BoolFunctor *local_38;
  
  *(undefined8 *)this = 0;
  local_38 = &this->bf_;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Liby::TcpClient,std::allocator<Liby::TcpClient>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_38,(TcpClient **)this,
             (allocator<Liby::TcpClient> *)&local_58);
  std::__shared_ptr<Liby::TcpClient,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<Liby::TcpClient,Liby::TcpClient>
            ((__shared_ptr<Liby::TcpClient,(__gnu_cxx::_Lock_policy)2> *)this,*(TcpClient **)this);
  uVar2 = *(undefined8 *)this;
  plVar3 = *(long **)&(this->bf_).super__Function_base._M_functor;
  if (plVar3 != (long *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)((long)plVar3 + 0xc) = *(int *)((long)plVar3 + 0xc) + 1;
      UNLOCK();
    }
    else {
      *(int *)((long)plVar3 + 0xc) = *(int *)((long)plVar3 + 0xc) + 1;
    }
    if (plVar3 != (long *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)((long)plVar3 + 0xc) = *(int *)((long)plVar3 + 0xc) + 1;
        UNLOCK();
      }
      else {
        *(int *)((long)plVar3 + 0xc) = *(int *)((long)plVar3 + 0xc) + 1;
      }
    }
  }
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_58._M_unused._M_object = operator_new(0x18);
  *(string **)local_58._M_unused._0_8_ = host;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = uVar2;
  *(long **)((long)local_58._M_unused._0_8_ + 0x10) = plVar3;
  pcStack_40 = std::
               _Function_handler<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/EventLoopGroup.cpp:105:24)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/EventLoopGroup.cpp:105:24)>
             ::_M_manager;
  Resolver::async_resolve(service,in_RCX,(ResolverHandler *)&local_58);
  _Var5._M_pi = extraout_RDX;
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
    _Var5._M_pi = extraout_RDX_00;
  }
  if (plVar3 != (long *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      piVar1 = (int *)((long)plVar3 + 0xc);
      iVar4 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
    }
    else {
      iVar4 = *(int *)((long)plVar3 + 0xc);
      *(int *)((long)plVar3 + 0xc) = iVar4 + -1;
    }
    if (iVar4 == 1) {
      (**(code **)(*plVar3 + 0x18))(plVar3);
      _Var5._M_pi = extraout_RDX_01;
    }
  }
  sVar6.super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  sVar6.super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<Liby::TcpClient>)
         sVar6.super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<TcpClient>
EventLoopGroup::creatTcpClient(const std::string &host,
                               const std::string &service) {
    std::shared_ptr<TcpClient> tcpClient = std::make_shared<TcpClient>();
    std::weak_ptr<TcpClient> weakTcpClient = tcpClient;

    Resolver::async_resolve(
        host, service, [this, weakTcpClient](std::list<Endpoint> eps) {
            if (weakTcpClient.expired() || eps.empty())
                return;

            auto tcpClient = weakTcpClient.lock();
            SockPtr sockPtr = std::make_shared<Socket>(eps.front());
            sockPtr->connect();

            EventLoop *loop = robinLoop1(sockPtr->fd());

            tcpClient->setEventLoop(loop);
            tcpClient->setSocket(sockPtr);

            // BUG tcpClient与当前线程不在一个线程上时,可能会引起内存错误
            //            tcpClient->start();
            // FIX
            if (loop == EventLoop::curr_thread_loop()) {
                tcpClient->start();
            } else {
                loop->runEventHandler([tcpClient] { tcpClient->start(); });
            }
        });
    return tcpClient;
}